

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufReplaceBufsByInvs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pNode;
  Mio_Gate_t *pMVar2;
  Mio_Gate_t *pMVar3;
  Abc_Obj_t *pFaninNew;
  uint uVar4;
  int i;
  
  i = 0;
  uVar4 = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      printf("Replaced %d buffers by invertor pairs.\n",(ulong)uVar4);
      return;
    }
    pNode = Abc_NtkObj(pNtk,i);
    if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
      iVar1 = Abc_NodeIsBuf(pNode);
      if (iVar1 != 0) {
        pMVar3 = (Mio_Gate_t *)(pNode->field_5).pData;
        pMVar2 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
        if (pMVar3 != pMVar2) {
          __assert_fail("pObj->pData == Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                        ,0x32e,"void Abc_BufReplaceBufsByInvs(Abc_Ntk_t *)");
        }
        pMVar3 = Mio_LibraryReadInv((Mio_Library_t *)pNtk->pManFunc);
        (pNode->field_5).pData = pMVar3;
        pFaninNew = Abc_NtkCreateNodeInv
                              (pNtk,(Abc_Obj_t *)
                                    pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
        Abc_ObjPatchFanin(pNode,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],
                          pFaninNew);
        uVar4 = uVar4 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_BufReplaceBufsByInvs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pInv;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsBuf(pObj) )
            continue;
        assert( pObj->pData == Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc) );
        pObj->pData = Mio_LibraryReadInv((Mio_Library_t *)pNtk->pManFunc);
        pInv = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanin0(pObj) );
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pInv );
        Counter++;
    }
    printf( "Replaced %d buffers by invertor pairs.\n", Counter );
}